

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O2

ssize_t __thiscall
LASreadItemCompressed_GPSTIME11_v1::read
          (LASreadItemCompressed_GPSTIME11_v1 *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  U32 UVar2;
  int iVar3;
  U64 UVar4;
  I32 pred;
  undefined4 in_register_00000034;
  IntegerCompressor *this_00;
  
  if (this->last_gpstime_diff == 0) {
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_0diff);
    if (UVar2 != 2) {
      if (UVar2 != 1) goto LAB_00129631;
      iVar3 = IntegerCompressor::decompress(this->ic_gpstime,0,0);
      this->last_gpstime_diff = iVar3;
      goto LAB_0012962b;
    }
  }
  else {
    UVar2 = ArithmeticDecoder::decodeSymbol(this->dec,this->m_gpstime_multi);
    if ((int)UVar2 < 0x1fe) {
      if (UVar2 == 0) {
        iVar3 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff / 4,2);
LAB_001295e4:
        iVar1 = this->multi_extreme_counter;
        this->multi_extreme_counter = iVar1 + 1;
        if (2 < iVar1) {
LAB_001295f4:
          this->last_gpstime_diff = iVar3;
          this->multi_extreme_counter = 0;
        }
      }
      else {
        if (UVar2 == 1) {
          iVar3 = IntegerCompressor::decompress(this->ic_gpstime,this->last_gpstime_diff,1);
          goto LAB_001295f4;
        }
        if ((int)UVar2 < 10) {
          this_00 = this->ic_gpstime;
          pred = this->last_gpstime_diff * UVar2;
          UVar2 = 3;
        }
        else {
          pred = this->last_gpstime_diff * UVar2;
          this_00 = this->ic_gpstime;
          if (0x31 < UVar2) {
            iVar3 = IntegerCompressor::decompress(this_00,pred,5);
            if (UVar2 != 0x1fd) goto LAB_0012962b;
            goto LAB_001295e4;
          }
          UVar2 = 4;
        }
        iVar3 = IntegerCompressor::decompress(this_00,pred,UVar2);
      }
LAB_0012962b:
      (this->last_gpstime).u64 = (this->last_gpstime).u64 + (long)iVar3;
      goto LAB_00129631;
    }
    if (UVar2 != 0x1fe) goto LAB_00129631;
  }
  UVar4 = ArithmeticDecoder::readInt64(this->dec);
  (this->last_gpstime).u64 = UVar4;
LAB_00129631:
  UVar4 = (this->last_gpstime).u64;
  *(U64 *)CONCAT44(in_register_00000034,__fd) = UVar4;
  return UVar4;
}

Assistant:

inline void LASreadItemCompressed_GPSTIME11_v1::read(U8* item, U32& context)
{
  I32 multi;
  if (last_gpstime_diff == 0) // if the last integer difference was zero
  {
    multi = dec->decodeSymbol(m_gpstime_0diff);
    if (multi == 1) // the difference can be represented with 32 bits
    {
      last_gpstime_diff = ic_gpstime->decompress(0, 0);
      last_gpstime.i64 += last_gpstime_diff;      
    }
    else if (multi == 2) // the difference is huge
    {
      last_gpstime.u64 = dec->readInt64();
    }
  }
  else
  {
    multi = dec->decodeSymbol(m_gpstime_multi);

    if (multi <  LASZIP_GPSTIME_MULTIMAX-2)
    {
      I32 gpstime_diff;
      if (multi == 1)
      {
        gpstime_diff = ic_gpstime->decompress(last_gpstime_diff, 1);
        last_gpstime_diff = gpstime_diff;
        multi_extreme_counter = 0;
      }
      else if (multi == 0)
      {
        gpstime_diff = ic_gpstime->decompress(last_gpstime_diff/4, 2);
        multi_extreme_counter++;
        if (multi_extreme_counter > 3)
        {
          last_gpstime_diff = gpstime_diff;
          multi_extreme_counter = 0;
        }
      }
      else if (multi < 10)
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 3);
      }
      else if (multi < 50)
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 4);
      }
      else
      {
        gpstime_diff = ic_gpstime->decompress(multi*last_gpstime_diff, 5);
        if (multi == LASZIP_GPSTIME_MULTIMAX-3)
        {
          multi_extreme_counter++;
          if (multi_extreme_counter > 3)
          {
            last_gpstime_diff = gpstime_diff;
            multi_extreme_counter = 0;
          }
        }
      }
      last_gpstime.i64 += gpstime_diff;
    }
    else if (multi <  LASZIP_GPSTIME_MULTIMAX-1)
    {
      last_gpstime.u64 = dec->readInt64();
    }
  }
  *((I64*)item) = last_gpstime.i64;
}